

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::showChoiceCB(Fl_File_Chooser *this)

{
  Fl_Menu_ *this_00;
  Fl_Choice *this_01;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char local_828 [8];
  char temp [2048];
  char *patend;
  char *patstart;
  char *item;
  Fl_File_Chooser *this_local;
  
  this_00 = &this->showChoice->super_Fl_Menu_;
  iVar1 = Fl_Choice::value(this->showChoice);
  pcVar2 = Fl_Menu_::text(this_00,iVar1);
  iVar1 = strcmp(pcVar2,custom_filter_label);
  if (iVar1 == 0) {
    pcVar2 = fl_input("%s",this->pattern_,custom_filter_label);
    if (pcVar2 != (char *)0x0) {
      fl_strlcpy(this->pattern_,pcVar2,0x800);
      quote_pathname(local_828,pcVar2,0x800);
      Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,local_828);
      this_01 = this->showChoice;
      iVar1 = Fl_Menu_::size(&this->showChoice->super_Fl_Menu_);
      Fl_Choice::value(this_01,iVar1 + -2);
    }
  }
  else {
    pcVar3 = strchr(pcVar2,0x28);
    if (pcVar3 == (char *)0x0) {
      fl_strlcpy(this->pattern_,pcVar2,0x800);
    }
    else {
      fl_strlcpy(this->pattern_,pcVar3 + 1,0x800);
      temp._2040_8_ = strrchr(this->pattern_,0x29);
      if ((char *)temp._2040_8_ != (char *)0x0) {
        *(char *)temp._2040_8_ = '\0';
      }
    }
  }
  Fl_File_Browser::filter(this->fileList,this->pattern_);
  iVar1 = shown(this);
  if (iVar1 != 0) {
    rescan_keep_filename(this);
  }
  return;
}

Assistant:

void
Fl_File_Chooser::showChoiceCB()
{
  const char	*item,			// Selected item
		*patstart;		// Start of pattern
  char		*patend;		// End of pattern
  char		temp[FL_PATH_MAX];		// Temporary string for pattern


  item = showChoice->text(showChoice->value());

  if (strcmp(item, custom_filter_label) == 0) {
    if ((item = fl_input("%s", pattern_, custom_filter_label)) != NULL) {
      strlcpy(pattern_, item, sizeof(pattern_));

      quote_pathname(temp, item, sizeof(temp));
      showChoice->add(temp);
      showChoice->value(showChoice->size() - 2);
    }
  } else if ((patstart = strchr(item, '(')) == NULL) {
    strlcpy(pattern_, item, sizeof(pattern_));
  } else {
    strlcpy(pattern_, patstart + 1, sizeof(pattern_));
    if ((patend = strrchr(pattern_, ')')) != NULL) *patend = '\0';
  }

  fileList->filter(pattern_);

  if (shown()) {
    // Rescan the directory...
    rescan_keep_filename();
  }
}